

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stretch.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *pppMVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  ostream *poVar7;
  size_t __nbytes;
  void *__buf;
  void *__buf_00;
  double duration;
  MidiFile midifile;
  Options options;
  string local_1c8;
  double local_1a8;
  double local_1a0;
  string local_198;
  MidiFile local_178;
  Options local_108;
  
  smf::Options::Options(&local_108);
  pppMVar1 = &local_178.m_events.
              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_178.m_events.super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pppMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"b|bars|m|measures=d:1.0","")
  ;
  paVar2 = &local_1c8.field_2;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,
             "Stretch width of bars (measures) by factor specified (WITHOUT affecting tempo)","");
  smf::Options::define(&local_108,(string *)&local_178,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if (local_178.m_events.
      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppMVar1) {
    operator_delete(local_178.m_events.
                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_178.m_events.super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pppMVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,"d|duration|t|tempo=d:1.0","");
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,"Stretch duration of track(s) by factor specified","");
  smf::Options::define(&local_108,(string *)&local_178,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if (local_178.m_events.
      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppMVar1) {
    operator_delete(local_178.m_events.
                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  __nbytes = 1;
  smf::Options::process(&local_108,argc,argv,1,0);
  iVar5 = smf::Options::getArgCount(&local_108);
  if (iVar5 == 2) {
    smf::MidiFile::MidiFile(&local_178);
    psVar6 = smf::Options::getArg_abi_cxx11_(&local_108,1);
    smf::MidiFile::read(&local_178,(int)psVar6,__buf,__nbytes);
    bVar3 = smf::MidiFile::status(&local_178);
    if (bVar3) {
      local_1c8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"bars","");
      bVar4 = smf::Options::getBoolean(&local_108,&local_1c8);
      bVar3 = true;
      if (!bVar4) {
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"duration","");
        bVar3 = smf::Options::getBoolean(&local_108,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      if (bVar3 != false) {
        local_1c8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"bars","");
        local_1a8 = smf::Options::getDouble(&local_108,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != paVar2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        local_1c8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"duration","");
        duration = smf::Options::getDouble(&local_108,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != paVar2) {
          local_1a0 = duration;
          operator_delete(local_1c8._M_dataplus._M_p);
          duration = local_1a0;
        }
        if ((((10.0 < duration) || (local_1a8 < 0.1)) || (10.0 < local_1a8)) || (duration < 0.1)) {
          std::operator<<((ostream *)&std::cerr,"stretch parameters must be between 0.1 and 10.\n");
          goto LAB_0010ebd0;
        }
        doStretch(&local_178,local_1a8,duration);
      }
      psVar6 = smf::Options::getArg_abi_cxx11_(&local_108,2);
      smf::MidiFile::write(&local_178,(int)psVar6,__buf_00,__nbytes);
      smf::MidiFile::~MidiFile(&local_178);
      smf::Options::~Options(&local_108);
      return 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error reading MIDI file ",0x18);
    psVar6 = smf::Options::getArg_abi_cxx11_(&local_108,1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"two MIDI filenames are required.\n");
  }
LAB_0010ebd0:
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
   Options options;
   options.define("b|bars|m|measures=d:1.0", 
      "Stretch width of bars (measures) by factor specified (WITHOUT affecting tempo)");
   options.define("d|duration|t|tempo=d:1.0",
      "Stretch duration of track(s) by factor specified");
   options.process(argc, argv);
   if (options.getArgCount() != 2) {
      cerr << "two MIDI filenames are required.\n";
      exit(1);
   }

   MidiFile midifile;
   midifile.read(options.getArg(1));
   if (!midifile.status()) {
      cerr << "Error reading MIDI file " << options.getArg(1) << endl;
      exit(1);
   }

   if (options.getBoolean("bars") || options.getBoolean("duration")) {
      double bars = options.getDouble("bars");
      double duration = options.getDouble("duration");
      if (bars < 0.1 || bars > 10.0 || duration < 0.1 || duration > 10.0) {
	  cerr << "stretch parameters must be between 0.1 and 10.\n";
	  exit(1);
      }
      doStretch(midifile, bars, duration);
   }

   midifile.write(options.getArg(2));
   return 0;
}